

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O1

void __thiscall
cmOSXBundleGenerator::GenerateMacOSXContentStatements
          (cmOSXBundleGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *sources,
          MacOSXContentGeneratorType *generator)

{
  bool bVar1;
  pointer ppcVar2;
  SourceFileFlags SVar3;
  
  bVar1 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar1) {
    for (ppcVar2 = (sources->
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar2 !=
        (sources->super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
        _M_impl.super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
      SVar3 = cmGeneratorTarget::GetTargetSourceFileFlags(this->GT,*ppcVar2);
      if (SVar3.Type != SourceFileTypeNormal) {
        (*generator->_vptr_MacOSXContentGeneratorType[2])(generator,*ppcVar2,SVar3.MacFolder);
      }
    }
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::GenerateMacOSXContentStatements(
  std::vector<cmSourceFile const*> const& sources,
  MacOSXContentGeneratorType* generator)
{
  if (this->MustSkip()) {
    return;
  }

  for (std::vector<cmSourceFile const*>::const_iterator si = sources.begin();
       si != sources.end(); ++si) {
    cmGeneratorTarget::SourceFileFlags tsFlags =
      this->GT->GetTargetSourceFileFlags(*si);
    if (tsFlags.Type != cmGeneratorTarget::SourceFileTypeNormal) {
      (*generator)(**si, tsFlags.MacFolder);
    }
  }
}